

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utility.cpp
# Opt level: O0

uint16_t Unpack16(uint8_t *p,size_t offset)

{
  int local_20;
  ushort local_1a;
  int i;
  uint16_t rc;
  size_t offset_local;
  uint8_t *p_local;
  
  local_1a = 0;
  _i = offset;
  for (local_20 = 0; local_20 < 2; local_20 = local_20 + 1) {
    local_1a = local_1a << 8 | (ushort)p[_i];
    _i = _i + 1;
  }
  return local_1a;
}

Assistant:

uint16_t Unpack16(const uint8_t* p, size_t offset)
{
    uint16_t rc = 0;
    for (int i = 0; i < 2; i++)
    {
        rc <<= 8;
        rc |= p[offset++];
    }
    return rc;
}